

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
ft::multimap<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>::clear
          (multimap<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *this)

{
  iterator local_40;
  iterator local_28;
  multimap<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *local_10;
  multimap<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *this_local;
  
  local_10 = this;
  treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
  ::begin(&local_28,
          (treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
           *)this);
  treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
  ::end(&local_40,
        (treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
         *)this);
  erase(this,&local_28,&local_40);
  treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  ::~treeIterator(&local_40);
  treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  ::~treeIterator(&local_28);
  return;
}

Assistant:

void clear() {
		this->erase(this->begin(), this->end());
	}